

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_test(stbi__context *s)

{
  int iVar1;
  stbi_uc *psVar2;
  
  iVar1 = stbi__pic_is4(s,anon_var_dwarf_7f20);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0x54;
    do {
      psVar2 = s->img_buffer;
      if (psVar2 < s->img_buffer_end) {
LAB_0010ba53:
        s->img_buffer = psVar2 + 1;
      }
      else if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar2 = s->img_buffer;
        goto LAB_0010ba53;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = stbi__pic_is4(s,"PICT");
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return iVar1;
}

Assistant:

static int stbi__pic_test(stbi__context *s)
{
   int r = stbi__pic_test_core(s);
   stbi__rewind(s);
   return r;
}